

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkHeader.cpp
# Opt level: O2

void __thiscall ShellLinkHeader::printHeader(ShellLinkHeader *this)

{
  uint uVar1;
  ostream *poVar2;
  ShellLinkHeader *pSVar3;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_138;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  undefined1 local_78 [48];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "____________________ShellLinkHeader______________________");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"HeaderSize:                         ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,&this->HeaderSize);
  Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bytes");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  std::operator<<((ostream *)&std::cout,"LinkCLSID:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&this->LinkCLSID);
  Utils::printSid((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"LinkFlags:                          ");
  std::endl<char,std::char_traits<char>>(poVar2);
  pSVar3 = (ShellLinkHeader *)(local_78 + 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pSVar3,&this->LinkFlags);
  uVar1 = Utils::vectFourBytesToUnsignedInt
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pSVar3,0);
  parseLinkFlags(pSVar3,uVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(local_78 + 0x18));
  poVar2 = std::operator<<((ostream *)&std::cout,"FileAttributes:                     ");
  std::endl<char,std::char_traits<char>>(poVar2);
  pSVar3 = (ShellLinkHeader *)local_78;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pSVar3,&this->FileAttributes);
  uVar1 = Utils::vectFourBytesToUnsignedInt
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pSVar3,0);
  parseFileAttributesFlags(pSVar3,uVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  std::operator<<((ostream *)&std::cout,"CreationTime:                       ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,&this->CreationTime);
  Utils::getDateFromPos((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_90);
  std::operator<<((ostream *)&std::cout,"AccessTime:                         ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,&this->AccessTime);
  Utils::getDateFromPos((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
  std::operator<<((ostream *)&std::cout,"WriteTime:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0,&this->WriteTime);
  Utils::getDateFromPos((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c0);
  poVar2 = std::operator<<((ostream *)&std::cout,"FileSize:                           ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8,&this->FileSize);
  Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bytes");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_d8);
  std::operator<<((ostream *)&std::cout,"IconIndex:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0,&this->IconIndex);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_f0);
  std::operator<<((ostream *)&std::cout,"ShowCommand:                        ");
  parseShowCommand(this);
  std::operator<<((ostream *)&std::cout,"HotKey:                             ");
  parseHotKeyFlags(this);
  std::operator<<((ostream *)&std::cout,"Reserved1:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108,&this->Reserved1);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_108);
  std::operator<<((ostream *)&std::cout,"Reserved2:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_120,&this->Reserved2);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_120);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_120);
  std::operator<<((ostream *)&std::cout,"Reserved3:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_138,&this->Reserved3);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_138);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_138);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void ShellLinkHeader::printHeader(){
        cout << "____________________ShellLinkHeader______________________" << endl;
        cout << "HeaderSize:                         " << dec << Utils::lenFourBytes(HeaderSize) << " bytes" << endl;
        cout << "LinkCLSID:                          "; Utils::printSid(LinkCLSID, 0); cout << endl;
        cout << "LinkFlags:                          " << endl;
            ShellLinkHeader::parseLinkFlags(Utils::vectFourBytesToUnsignedInt(LinkFlags,0));
        cout << "FileAttributes:                     " << endl;
            ShellLinkHeader::parseFileAttributesFlags(Utils::vectFourBytesToUnsignedInt(FileAttributes,0));
        cout << "CreationTime:                       "; Utils::getDateFromPos(CreationTime, 0);
        cout << "AccessTime:                         "; Utils::getDateFromPos(AccessTime, 0);
        cout << "WriteTime:                          "; Utils::getDateFromPos(WriteTime, 0);
        cout << "FileSize:                           " << dec << Utils::lenFourBytes(FileSize) << " bytes" << endl;
        cout << "IconIndex:                          "; Utils::print_vec(IconIndex);
        cout << "ShowCommand:                        "; ShellLinkHeader::parseShowCommand();
        cout << "HotKey:                             "; ShellLinkHeader::parseHotKeyFlags();
        cout << "Reserved1:                          "; Utils::print_vec(Reserved1);
        cout << "Reserved2:                          "; Utils::print_vec(Reserved2);
        cout << "Reserved3:                          "; Utils::print_vec(Reserved3);
        cout << "_________________________________________________________" << endl;
    }